

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O0

void av1_save_layer_context(AV1_COMP *cpi)

{
  CYCLIC_REFRESH *pCVar1;
  int8_t *piVar2;
  int iVar3;
  SVC *pSVar4;
  LAYER_CONTEXT *__dest;
  AV1_COMP *in_RDI;
  int sl;
  uint i;
  char *temp;
  CYCLIC_REFRESH *cr;
  LAYER_CONTEXT *lc;
  AV1_COMMON *cm;
  SVC *svc;
  int local_38;
  uint local_34;
  
  pSVar4 = &in_RDI->svc;
  __dest = get_layer_context(in_RDI);
  memcpy(__dest,&in_RDI->rc,0x140);
  memcpy(&__dest->p_rc,&in_RDI->ppi->p_rc,0x31d8);
  __dest->target_bandwidth = (long)(int)(in_RDI->oxcf).rc_cfg.target_bandwidth;
  __dest->group_index = in_RDI->gf_frame_index;
  __dest->max_mv_magnitude = (in_RDI->mv_search_params).max_mv_magnitude;
  if (pSVar4->spatial_layer_id == 0) {
    (in_RDI->svc).base_framerate = in_RDI->framerate;
  }
  if ((((in_RDI->oxcf).q_cfg.aq_mode == '\x03') && (1 < (in_RDI->svc).number_spatial_layers)) &&
     ((in_RDI->svc).temporal_layer_id == 0)) {
    pCVar1 = in_RDI->cyclic_refresh;
    piVar2 = __dest->map;
    __dest->map = pCVar1->map;
    pCVar1->map = piVar2;
    __dest->sb_index = pCVar1->sb_index;
    __dest->actual_num_seg1_blocks = pCVar1->actual_num_seg1_blocks;
    __dest->actual_num_seg2_blocks = pCVar1->actual_num_seg2_blocks;
    __dest->counter_encode_maxq_scene_change = pCVar1->counter_encode_maxq_scene_change;
  }
  if ((in_RDI->is_dropped_frame & 1U) == 0) {
    av1_svc_update_buffer_slot_refreshed(in_RDI);
    for (local_34 = 0; local_34 < 8; local_34 = local_34 + 1) {
      iVar3 = frame_is_intra_only(&in_RDI->common);
      if ((iVar3 != 0) ||
         (((in_RDI->common).current_frame.refresh_frame_flags & 1 << ((byte)local_34 & 0x1f)) != 0))
      {
        (in_RDI->svc).spatial_layer_fb[local_34] = pSVar4->spatial_layer_id;
        (in_RDI->svc).temporal_layer_fb[local_34] = (in_RDI->svc).temporal_layer_id;
      }
    }
  }
  if (pSVar4->spatial_layer_id == (in_RDI->svc).number_spatial_layers + -1) {
    (in_RDI->svc).current_superframe = (in_RDI->svc).current_superframe + 1;
    for (local_38 = 0; local_38 < (in_RDI->svc).number_spatial_layers; local_38 = local_38 + 1) {
      (in_RDI->svc).drop_spatial_layer[local_38] = false;
    }
  }
  return;
}

Assistant:

void av1_save_layer_context(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  const AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = get_layer_context(cpi);
  lc->rc = cpi->rc;
  lc->p_rc = cpi->ppi->p_rc;
  lc->target_bandwidth = (int)cpi->oxcf.rc_cfg.target_bandwidth;
  lc->group_index = cpi->gf_frame_index;
  lc->max_mv_magnitude = cpi->mv_search_params.max_mv_magnitude;
  if (svc->spatial_layer_id == 0) svc->base_framerate = cpi->framerate;
  // For spatial-svc, allow cyclic-refresh to be applied on the spatial layers,
  // for the base temporal layer.
  if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->svc.number_spatial_layers > 1 && svc->temporal_layer_id == 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    signed char *temp = lc->map;
    lc->map = cr->map;
    cr->map = temp;
    lc->sb_index = cr->sb_index;
    lc->actual_num_seg1_blocks = cr->actual_num_seg1_blocks;
    lc->actual_num_seg2_blocks = cr->actual_num_seg2_blocks;
    lc->counter_encode_maxq_scene_change = cr->counter_encode_maxq_scene_change;
  }
  if (!cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    for (unsigned int i = 0; i < REF_FRAMES; i++) {
      if (frame_is_intra_only(cm) ||
          cm->current_frame.refresh_frame_flags & (1 << i)) {
        svc->spatial_layer_fb[i] = svc->spatial_layer_id;
        svc->temporal_layer_fb[i] = svc->temporal_layer_id;
      }
    }
  }
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->current_superframe++;
    // Reset drop flag to false for next superframe.
    for (int sl = 0; sl < svc->number_spatial_layers; sl++)
      svc->drop_spatial_layer[sl] = false;
  }
}